

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  long lVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *__s;
  cmInstallScriptGenerator *pcVar9;
  cmGlobalGenerator *this_00;
  pointer pbVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  pointer pbVar14;
  bool bVar15;
  string script;
  string component;
  string local_98;
  cmInstallCommand *local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_70[0] = local_60;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_78 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 == pbVar14) {
LAB_0027666c:
    if (pbVar10 == pbVar14) {
LAB_00276972:
      this_00 = cmMakefile::GetGlobalGenerator((local_78->super_cmCommand).Makefile);
      bVar15 = true;
      cmGlobalGenerator::AddInstallComponent(this_00,(char *)local_70[0]);
      goto LAB_00276990;
    }
    lVar12 = 0;
    uVar13 = 0;
    bVar4 = false;
    bVar6 = false;
    do {
      iVar11 = std::__cxx11::string::compare((char *)((long)&(pbVar14->_M_dataplus)._M_p + lVar12));
      if (iVar11 == 0) {
        bVar6 = true;
LAB_00276867:
        bVar4 = false;
      }
      else {
        iVar11 = std::__cxx11::string::compare
                           ((char *)((long)&(((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar12));
        if (iVar11 == 0) {
          bVar4 = true;
          bVar6 = false;
        }
        else {
          iVar11 = std::__cxx11::string::compare
                             ((char *)((long)&(((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar12));
          if (iVar11 == 0) {
            bVar6 = false;
            goto LAB_00276867;
          }
          if (bVar6) {
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            lVar2 = *(long *)((long)&(pbVar10->_M_dataplus)._M_p + lVar12);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,lVar2,
                       *(long *)((long)&pbVar10->_M_string_length + lVar12) + lVar2);
            bVar6 = cmsys::SystemTools::FileIsFullPath(local_98._M_dataplus._M_p);
            if (!bVar6) {
              __s = cmMakefile::GetCurrentSourceDirectory((local_78->super_cmCommand).Makefile);
              sVar5 = local_98._M_string_length;
              strlen(__s);
              std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)sVar5,(ulong)__s);
              std::__cxx11::string::append((char *)&local_98);
              std::__cxx11::string::_M_append
                        ((char *)&local_98,
                         *(ulong *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar12));
            }
            bVar7 = cmsys::SystemTools::FileIsDirectory(&local_98);
            if (bVar7) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"given a directory as value of SCRIPT argument.","");
              cmCommand::SetError(&local_78->super_cmCommand,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              pcVar3 = (local_78->super_cmCommand).Makefile;
              pcVar9 = (cmInstallScriptGenerator *)operator_new(0xe0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar9,local_98._M_dataplus._M_p,false,(char *)local_70[0]);
              cmMakefile::AddInstallGenerator(pcVar3,(cmInstallGenerator *)pcVar9);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            bVar6 = false;
            bVar15 = false;
            if (bVar7) goto LAB_00276990;
          }
          else if (bVar4) {
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            lVar2 = *(long *)((long)&(pbVar10->_M_dataplus)._M_p + lVar12);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,lVar2,
                       *(long *)((long)&pbVar10->_M_string_length + lVar12) + lVar2);
            pcVar3 = (local_78->super_cmCommand).Makefile;
            pcVar9 = (cmInstallScriptGenerator *)operator_new(0xe0);
            cmInstallScriptGenerator::cmInstallScriptGenerator
                      (pcVar9,local_98._M_dataplus._M_p,true,(char *)local_70[0]);
            cmMakefile::AddInstallGenerator(pcVar3,(cmInstallGenerator *)pcVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00276867;
          }
        }
      }
      uVar13 = uVar13 + 1;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (uVar13 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5
                             ));
    if (bVar6) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"given no value for SCRIPT argument.","");
      cmCommand::SetError(&local_78->super_cmCommand,&local_98);
    }
    else {
      if (!bVar4) goto LAB_00276972;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"given no value for CODE argument.","");
      cmCommand::SetError(&local_78->super_cmCommand,&local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_00276657;
  }
  else {
    uVar13 = 0;
    iVar11 = 0;
    do {
      iVar8 = std::__cxx11::string::compare((char *)(pbVar14 + uVar13));
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((iVar8 == 0) && (uVar13 + 1 < (ulong)((long)pbVar10 - (long)pbVar14 >> 5))) {
        std::__cxx11::string::_M_assign((string *)local_70);
        iVar11 = iVar11 + 1;
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        uVar13 = uVar13 + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)pbVar10 - (long)pbVar14 >> 5));
    if (iVar11 < 2) goto LAB_0027666c;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    cmCommand::SetError(&local_78->super_cmCommand,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_00276657:
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar15 = false;
LAB_00276990:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return bVar15;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMPONENT" && i+1 < args.size())
        {
        ++componentCount;
        ++i;
        component = args[i];
        }
    }

  if(componentCount>1)
    {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
      "signature of the INSTALL command. "
      "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
    }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "SCRIPT")
      {
      doing_script = true;
      doing_code = false;
      }
    else if(args[i] == "CODE")
      {
      doing_script = false;
      doing_code = true;
      }
    else if(args[i] == "COMPONENT")
      {
      doing_script = false;
      doing_code = false;
      }
    else if(doing_script)
      {
      doing_script = false;
      std::string script = args[i];
      if(!cmSystemTools::FileIsFullPath(script.c_str()))
        {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += args[i];
        }
      if(cmSystemTools::FileIsDirectory(script))
        {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
        }
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(script.c_str(), false,
                                     component.c_str()));
      }
    else if(doing_code)
      {
      doing_code = false;
      std::string code = args[i];
      this->Makefile->AddInstallGenerator(
        new cmInstallScriptGenerator(code.c_str(), true,
                                     component.c_str()));
      }
    }

  if(doing_script)
    {
    this->SetError("given no value for SCRIPT argument.");
    return false;
    }
  if(doing_code)
    {
    this->SetError("given no value for CODE argument.");
    return false;
    }

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(component.c_str());

  return true;
}